

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::EitherExpectation::~EitherExpectation(EitherExpectation *this)

{
  pointer pCVar1;
  
  (this->super_ExpectationMixin<(wabt::ExpectationType)1>).super_Expectation._vptr_Expectation =
       (_func_int **)&PTR__Expectation_001a5500;
  pCVar1 = (this->super_ExpectationMixin<(wabt::ExpectationType)1>).super_Expectation.expected.
           super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->super_ExpectationMixin<(wabt::ExpectationType)1>).
                                 super_Expectation.expected.
                                 super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit EitherExpectation(const Location& loc = Location())
      : ExpectationMixin<ExpectationType::Either>(loc) {}